

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c352.c
# Opt level: O2

void c352_update(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  int *piVar1;
  size_t __n;
  byte bVar2;
  undefined2 uVar3;
  uint uVar4;
  uint uVar5;
  DEV_SMPL *pDVar6;
  DEV_SMPL *pDVar7;
  short sVar8;
  ushort uVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  
  __n = (ulong)samples * 4;
  uVar22 = 0;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  do {
    if (uVar22 == samples) {
      return;
    }
    iVar15 = 0;
    iVar16 = 0;
    iVar17 = 0;
    iVar19 = 0;
    for (lVar18 = 0x2c; lVar18 != 0x4ac; lVar18 = lVar18 + 0x24) {
      uVar9 = *(ushort *)((long)chip + lVar18 + -10);
      uVar20 = (uint)uVar9;
      iVar13 = 0;
      if ((short)uVar9 < 0) {
        uVar4 = *(uint *)((long)chip + lVar18 + -0x1c);
        uVar14 = *(ushort *)((long)chip + lVar18 + -0xc) + uVar4;
        if ((uVar14 >> 0x10 & 1) != 0) {
          *(undefined2 *)((long)chip + lVar18 + -0x16) =
               *(undefined2 *)((long)chip + lVar18 + -0x18);
          if ((uVar9 & 0x10) == 0) {
            uVar5 = *(uint *)((long)chip + lVar18 + -0x20);
            bVar2 = *(byte *)(*(long *)((long)chip + 0x490) +
                             (ulong)(*(uint *)((long)chip + 0x49c) & uVar5));
            if ((uVar9 & 8) == 0) {
              sVar8 = (ushort)bVar2 << 8;
            }
            else {
              sVar8 = *(short *)((long)chip + (ulong)bVar2 * 2 + 0x4a2);
            }
            *(short *)((long)chip + lVar18 + -0x18) = sVar8;
            sVar8 = (short)uVar5;
            if ((~uVar9 & 3) == 0) {
              if (((uVar9 & 0x40) == 0) || (*(short *)((long)chip + lVar18 + -2) != sVar8)) {
                if ((uVar9 & 0x40) == 0) {
                  if (*(short *)((long)chip + lVar18 + -4) == sVar8) {
                    uVar20 = uVar20 | 0x40;
                    goto LAB_00162ed4;
                  }
                  uVar11 = 1;
                }
                else {
                  uVar11 = 0xffffffff;
                }
              }
              else {
                uVar20 = uVar20 & 0xffbf;
LAB_00162ed4:
                *(short *)((long)chip + lVar18 + -10) = (short)uVar20;
                uVar11 = -(uVar20 >> 6 & 1) | 1;
              }
              *(uint *)((long)chip + lVar18 + -0x20) = uVar11 + uVar5;
            }
            else if (*(short *)((long)chip + lVar18 + -4) == sVar8) {
              if ((~uVar9 & 0x22) == 0) {
                *(uint *)((long)chip + lVar18 + -0x20) =
                     CONCAT22(*(undefined2 *)((long)chip + lVar18 + -6),
                              *(undefined2 *)((long)chip + lVar18 + -2));
              }
              else {
                if ((uVar9 & 2) == 0) {
                  uVar20 = uVar20 & 0x5ffd | 0x2000;
                  *(short *)((long)chip + lVar18 + -10) = (short)uVar20;
                  *(undefined2 *)((long)chip + lVar18 + -0x18) = 0;
                  goto LAB_00162f51;
                }
                *(uint *)((long)chip + lVar18 + -0x20) =
                     (uint)*(ushort *)((long)chip + lVar18 + -2) | uVar5 & 0xff0000;
              }
              uVar20 = uVar20 | 0x800;
              *(short *)((long)chip + lVar18 + -10) = (short)uVar20;
            }
            else {
              *(uint *)((long)chip + lVar18 + -0x20) = uVar5 + (-(uVar20 & 1) | 1);
            }
          }
          else {
            uVar9 = -(*(ushort *)((long)chip + 0x48c) & 1) & 0xfff6 ^
                    *(ushort *)((long)chip + 0x48c) >> 1;
            *(ushort *)((long)chip + 0x48c) = uVar9;
            *(ushort *)((long)chip + lVar18 + -0x18) = uVar9;
          }
        }
LAB_00162f51:
        if (((uVar4 ^ uVar14) & 0x18000) != 0) {
          uVar3 = *(undefined2 *)((long)chip + lVar18 + -0x14);
          bVar2 = *(byte *)((long)chip + lVar18 + -0x10);
          bVar10 = (byte)((ushort)uVar3 >> 8);
          if (bVar2 != bVar10) {
            *(byte *)((long)chip + lVar18 + -0x10) = (-(bVar10 < bVar2) | 1U) + bVar2;
          }
          bVar2 = *(byte *)((long)chip + lVar18 + -0xf);
          bVar10 = (byte)uVar3;
          if (bVar2 != bVar10) {
            *(byte *)((long)chip + lVar18 + -0xf) = (-(bVar10 < bVar2) | 1U) + bVar2;
          }
          uVar3 = *(undefined2 *)((long)chip + lVar18 + -0x12);
          bVar2 = *(byte *)((long)chip + lVar18 + -0xe);
          bVar10 = (byte)((ushort)uVar3 >> 8);
          if (bVar2 != bVar10) {
            *(byte *)((long)chip + lVar18 + -0xe) = (-(bVar10 < bVar2) | 1U) + bVar2;
          }
          bVar2 = *(byte *)((long)chip + lVar18 + -0xd);
          bVar10 = (byte)uVar3;
          if (bVar2 != bVar10) {
            *(byte *)((long)chip + lVar18 + -0xd) = (-(bVar10 < bVar2) | 1U) + bVar2;
          }
        }
        *(uint *)((long)chip + lVar18 + -0x1c) = uVar14 & 0xffff;
        if ((uVar20 & 4) == 0) {
          sVar8 = *(short *)((long)chip + lVar18 + -0x16);
          iVar13 = (int)(((long)*(short *)((long)chip + lVar18 + -0x18) - (long)sVar8) *
                         (ulong)(uVar14 & 0xffff) >> 0x10) + (int)sVar8;
        }
        else {
          iVar13 = (int)*(short *)((long)chip + lVar18 + -0x18);
        }
      }
      if (*(char *)((long)chip + lVar18) == '\0') {
        iVar12 = -iVar13;
        iVar21 = iVar12;
        if ((uVar20 >> 8 & 1) == 0) {
          iVar21 = iVar13;
        }
        iVar19 = iVar19 + ((int)((uint)*(byte *)((long)chip + lVar18 + -0x10) * iVar21) >> 8);
        iVar21 = iVar12;
        if ((uVar20 >> 9 & 1) == 0) {
          iVar21 = iVar13;
        }
        iVar16 = iVar16 + ((int)((uint)*(byte *)((long)chip + lVar18 + -0xe) * iVar21) >> 8);
        if (-1 < (char)uVar20) {
          iVar12 = iVar13;
        }
        iVar17 = iVar17 + ((int)((uint)*(byte *)((long)chip + lVar18 + -0xf) * iVar12) >> 8);
        iVar15 = iVar15 + ((int)((uint)*(byte *)((long)chip + lVar18 + -0xd) * iVar12) >> 8);
      }
    }
    pDVar6 = *outputs;
    piVar1 = pDVar6 + uVar22;
    *piVar1 = *piVar1 + iVar19;
    pDVar7 = outputs[1];
    piVar1 = pDVar7 + uVar22;
    *piVar1 = *piVar1 + iVar17;
    if ((*(char *)((long)chip + 0x4a0) == '\0') && (*(char *)((long)chip + 0x4a1) == '\0')) {
      piVar1 = pDVar6 + uVar22;
      *piVar1 = *piVar1 + iVar16;
      piVar1 = pDVar7 + uVar22;
      *piVar1 = *piVar1 + iVar15;
    }
    uVar22 = uVar22 + 1;
  } while( true );
}

Assistant:

static void c352_update(void *chip, UINT32 samples, DEV_SMPL **outputs)
{
	C352 *c = (C352 *)chip;
	UINT32 i, j;
	INT32 s;
	INT32 next_counter;
	C352_Voice* v;

	DEV_SMPL out[4];

	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));

	for(i=0;i<samples;i++)
	{
		out[0]=out[1]=out[2]=out[3]=0;

		for(j=0;j<C352_VOICES;j++)
		{

			v = &c->v[j];
			s = 0;

			if(v->flags & C352_FLG_BUSY)
			{
				next_counter = v->counter+v->freq;

				if(next_counter & 0x10000)
				{
					C352_fetch_sample(c,v);
				}

				if((next_counter^v->counter) & 0x18000)
				{
					c352_ramp_volume(v,0,v->vol_f>>8);
					c352_ramp_volume(v,1,v->vol_f&0xff);
					c352_ramp_volume(v,2,v->vol_r>>8);
					c352_ramp_volume(v,3,v->vol_r&0xff);
				}

				v->counter = next_counter&0xffff;

				// Interpolate samples
				if((v->flags & C352_FLG_FILTER) == 0)
					s = v->last_sample + (INT32)((INT64)v->counter*(v->sample-v->last_sample)>>16);
				else
					s = v->sample;
			}

			if(!c->v[j].mute)
			{
				// Left
				out[0] += (((v->flags & C352_FLG_PHASEFL) ? -s : s) * v->curr_vol[0])>>8;
				out[2] += (((v->flags & C352_FLG_PHASERL) ? -s : s) * v->curr_vol[2])>>8;

				// Right
				out[1] += (((v->flags & C352_FLG_PHASEFR) ? -s : s) * v->curr_vol[1])>>8;
				out[3] += (((v->flags & C352_FLG_PHASEFR) ? -s : s) * v->curr_vol[3])>>8;
			}
		}

		outputs[0][i] += out[0];
		outputs[1][i] += out[1];
		if (!c->muteRear && !c->optMuteRear)
		{
			outputs[0][i] += out[2];
			outputs[1][i] += out[3];
		}
	}
}